

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool CompileModuleFromSource(CompilerContext *ctx)

{
  ExpressionContext *ctx_00;
  CompilerStatistics *this;
  SynBase *pSVar1;
  uint uVar2;
  int iVar3;
  ExprModule *pEVar4;
  VmModule *pVVar5;
  void *pvVar6;
  LlvmModule *pLVar7;
  RegVmLoweredModule *lowModule;
  RegVmLoweredFunction **ppRVar8;
  char *pcVar9;
  bool bVar10;
  TraceScope traceScope_1;
  TraceScope traceScope;
  InstructionRegVmLowerGraphContext instRegVmLowerGraphCtx;
  
  if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
    iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
    if (iVar3 != 0) {
      CompileModuleFromSource::token = NULLC::TraceGetToken("compiler","CompileModuleFromSource");
      __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,CompileModuleFromSource::token);
  pEVar4 = AnalyzeModuleFromSource(ctx);
  if (pEVar4 != (ExprModule *)0x0) {
    uVar2 = NULLCTime::clockMicro();
    (ctx->statistics).startTime = uVar2;
    (ctx->statistics).finishTime = 0;
    ctx_00 = &ctx->exprCtx;
    pVVar5 = CompileVm(ctx_00,&ctx->exprModule->super_ExprBase,ctx->code);
    ctx->vmModule = pVVar5;
    uVar2 = NULLCTime::clockMicro();
    this = &ctx->statistics;
    CompilerStatistics::Finish(this,"IrCodeGen",uVar2);
    if (ctx->vmModule != (VmModule *)0x0) {
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      if (ctx->enableLogFiles == true) {
        if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
          iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
          if (iVar3 != 0) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
        }
        NULLC::TraceScope::TraceScope
                  (&traceScope_1,CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x266,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar6 = (*(ctx->outputCtx).openStream)("inst_graph.txt");
        (ctx->outputCtx).stream = pvVar6;
        if (pvVar6 != (void *)0x0) {
          instRegVmLowerGraphCtx.output = &ctx->outputCtx;
          instRegVmLowerGraphCtx.code = (char *)0x0;
          instRegVmLowerGraphCtx.lastStart =
               (char *)((ulong)instRegVmLowerGraphCtx.lastStart & 0xffffffff00000000);
          instRegVmLowerGraphCtx.lastStartOffset = 0;
          instRegVmLowerGraphCtx.lastEndOffset = 0;
          instRegVmLowerGraphCtx.showSource = false;
          instRegVmLowerGraphCtx.showAnnotatedSource = false;
          instRegVmLowerGraphCtx._34_6_ = 0;
          PrintGraph((InstructionVMGraphContext *)&instRegVmLowerGraphCtx,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope(&traceScope_1);
      }
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"Logging",uVar2);
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      pLVar7 = CompileLlvm(ctx_00,ctx->exprModule);
      ctx->llvmModule = pLVar7;
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"LlvmCodeGen",uVar2);
      OptimizeModule(ctx);
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_UPDATE_LIVE_SETS);
      if (1 < ctx->optimizationLevel) {
        RunVmPass(ctx_00,ctx->vmModule,VM_PASS_PREPARE_SSA_EXIT);
      }
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_BITCASTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_EXTRACTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_CREATE_ALLOCA_STORAGE);
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"IrFinalization",uVar2);
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      if (ctx->enableLogFiles == true) {
        if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
          iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
          if (iVar3 != 0) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph_opt");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
        }
        NULLC::TraceScope::TraceScope
                  (&traceScope_1,CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x29c,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar6 = (*(ctx->outputCtx).openStream)("inst_graph_opt.txt");
        (ctx->outputCtx).stream = pvVar6;
        if (pvVar6 != (void *)0x0) {
          instRegVmLowerGraphCtx.output = &ctx->outputCtx;
          instRegVmLowerGraphCtx.code = (char *)0x0;
          instRegVmLowerGraphCtx.lastStart =
               (char *)((ulong)instRegVmLowerGraphCtx.lastStart & 0xffffffff00000000);
          instRegVmLowerGraphCtx.lastStartOffset = 0;
          instRegVmLowerGraphCtx.lastEndOffset = 0;
          instRegVmLowerGraphCtx.showSource = false;
          instRegVmLowerGraphCtx.showAnnotatedSource = false;
          instRegVmLowerGraphCtx._34_6_ = 0;
          PrintGraph((InstructionVMGraphContext *)&instRegVmLowerGraphCtx,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope(&traceScope_1);
      }
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"Logging",uVar2);
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      lowModule = RegVmLowerModule(ctx_00,ctx->vmModule);
      ctx->regVmLoweredModule = lowModule;
      if ((lowModule->functions).count != 0) {
        ppRVar8 = SmallArray<RegVmLoweredFunction_*,_32U>::back(&lowModule->functions);
        lowModule = ctx->regVmLoweredModule;
        if ((*ppRVar8)->hasRegisterOverflow == true) {
          ppRVar8 = SmallArray<RegVmLoweredFunction_*,_32U>::back(&lowModule->functions);
          if (((*ppRVar8)->registerOverflowLocation == (VmInstruction *)0x0) ||
             (pSVar1 = ((*ppRVar8)->registerOverflowLocation->super_VmValue).source,
             pSVar1 == (SynBase *)0x0)) {
            pcVar9 = (char *)0x0;
          }
          else {
            pcVar9 = pSVar1->begin->pos;
          }
          ctx->errorPos = pcVar9;
          if ((ctx->errorBuf != (char *)0x0) && ((ulong)ctx->errorBufSize != 0)) {
            NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                               "ERROR: internal compiler error: register count overflow");
            if (ctx->errorPos != (char *)0x0) {
              pcVar9 = FindModuleCodeWithSourceLocation(ctx_00,ctx->errorPos);
              AddErrorLocationInfo(pcVar9,ctx->errorPos,ctx->errorBuf,ctx->errorBufSize);
            }
          }
          goto LAB_0012445a;
        }
      }
      RegVmFinalizeModule(&ctx->instRegVmFinalizeCtx,lowModule);
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"IrLowering",uVar2);
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      if (ctx->enableLogFiles == true) {
        if (CompileModuleFromSource(CompilerContext&)::token == '\0') {
          iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token);
          if (iVar3 != 0) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph_reg_low");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
        }
        NULLC::TraceScope::TraceScope
                  (&traceScope_1,CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x2d3,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar6 = (*(ctx->outputCtx).openStream)("inst_graph_reg_low.txt");
        (ctx->outputCtx).stream = pvVar6;
        if (pvVar6 != (void *)0x0) {
          instRegVmLowerGraphCtx.output = &ctx->outputCtx;
          instRegVmLowerGraphCtx.code = (char *)0x0;
          instRegVmLowerGraphCtx._33_7_ = instRegVmLowerGraphCtx._33_7_ & 0xffffffffffff00;
          instRegVmLowerGraphCtx.lastStart = (char *)0x0;
          instRegVmLowerGraphCtx.lastStartOffset = 0;
          instRegVmLowerGraphCtx.lastEndOffset = 0;
          instRegVmLowerGraphCtx.showSource = true;
          PrintGraph(&instRegVmLowerGraphCtx,ctx->regVmLoweredModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope(&traceScope_1);
      }
      uVar2 = NULLCTime::clockMicro();
      bVar10 = true;
      CompilerStatistics::Finish(this,"Logging",uVar2);
      goto LAB_0012445c;
    }
    ctx->errorPos = (char *)0x0;
    if ((ctx->errorBuf != (char *)0x0) && ((ulong)ctx->errorBufSize != 0)) {
      bVar10 = false;
      NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                         "ERROR: internal compiler error: failed to create VmModule");
      goto LAB_0012445c;
    }
  }
LAB_0012445a:
  bVar10 = false;
LAB_0012445c:
  NULLC::TraceScope::~TraceScope(&traceScope);
  return bVar10;
}

Assistant:

bool CompileModuleFromSource(CompilerContext &ctx)
{
	TRACE_SCOPE("compiler", "CompileModuleFromSource");

	if(!AnalyzeModuleFromSource(ctx))
		return false;

	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.vmModule = CompileVm(exprCtx, ctx.exprModule, ctx.code);

	ctx.statistics.Finish("IrCodeGen", NULLCTime::clockMicro());

	if(!ctx.vmModule)
	{
		ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: failed to create VmModule");

		return false;
	}

	//printf("# Instruction memory %dkb\n", pool.GetSize() / 1024);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Build LLVM module is support is enabled or just to test execution paths in debug build
#if defined(NULLC_LLVM_SUPPORT)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#elif !defined(NDEBUG)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#endif

	ctx.statistics.Finish("LlvmCodeGen", NULLCTime::clockMicro());

	OptimizeModule(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_UPDATE_LIVE_SETS);

	if(ctx.optimizationLevel >= 2)
		RunVmPass(exprCtx, ctx.vmModule, VM_PASS_PREPARE_SSA_EXIT);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_BITCASTS);
	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_EXTRACTS);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_CREATE_ALLOCA_STORAGE);

	ctx.statistics.Finish("IrFinalization", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_opt");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_opt.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.regVmLoweredModule = RegVmLowerModule(exprCtx, ctx.vmModule);

	if(!ctx.regVmLoweredModule->functions.empty() && ctx.regVmLoweredModule->functions.back()->hasRegisterOverflow)
	{
		RegVmLoweredFunction *function = ctx.regVmLoweredModule->functions.back();

		if(function->registerOverflowLocation && function->registerOverflowLocation->source)
			ctx.errorPos = function->registerOverflowLocation->source->begin->pos;
		else
			ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: register count overflow");

			if(ctx.errorPos)
				AddErrorLocationInfo(FindModuleCodeWithSourceLocation(ctx.exprCtx, ctx.errorPos), ctx.errorPos, ctx.errorBuf, ctx.errorBufSize);
		}

		return false;
	}

	RegVmFinalizeModule(ctx.instRegVmFinalizeCtx, ctx.regVmLoweredModule);

	ctx.statistics.Finish("IrLowering", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_reg_low");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_reg_low.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionRegVmLowerGraphContext instRegVmLowerGraphCtx(ctx.outputCtx);

			instRegVmLowerGraphCtx.showSource = true;

			PrintGraph(instRegVmLowerGraphCtx, ctx.regVmLoweredModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	return true;
}